

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

Status __thiscall HighsLpRelaxation::resolveLp(HighsLpRelaxation *this,HighsDomain *domain)

{
  double dVar1;
  value_type vVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  Status SVar6;
  HighsInt HVar7;
  pointer pHVar8;
  uint *puVar9;
  const_reference __b;
  HighsBasis *pHVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  i64 iVar14;
  int *piVar15;
  pair<double,_int> *ppVar16;
  reference pvVar17;
  HighsLp *pHVar18;
  double *pdVar19;
  size_type sVar20;
  const_reference pvVar21;
  reference pvVar22;
  const_reference pvVar23;
  Reason *pRVar24;
  HighsDomain *in_RSI;
  long *in_RDI;
  double dVar25;
  HighsInt i_3;
  vector<double,_std::allocator<double>_> fixSol;
  HighsInt i_2;
  HighsInt i_1;
  HighsInt k;
  vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
  *cliquesubst;
  HighsInt col_1;
  pair<int,_double> *fracint;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range4;
  vector<double,_std::allocator<double>_> roundsol;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *it;
  iterator __end3_1;
  iterator __begin3_1;
  HighsHashTable<int,_std::pair<double,_int>_> *__range3_1;
  HighsInt row;
  HighsInt j;
  HighsInt colEnd;
  HighsInt colStart;
  HighsSparseMatrix *matrix;
  double gub;
  double glb;
  ValueType *pair;
  Substitution *subst;
  HighsInt col;
  double val;
  HighsInt i;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  bool roundable;
  HighsCDouble objsum;
  HighsSolution *sol;
  HighsHashTable<int,_std::pair<double,_int>_> fracints;
  bool solveagain;
  undefined1 in_stack_00005387;
  HighsLpRelaxation *in_stack_00005388;
  undefined4 in_stack_fffffffffffffb48;
  HighsInt in_stack_fffffffffffffb4c;
  HighsMipSolver *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined2 in_stack_fffffffffffffb5c;
  undefined1 in_stack_fffffffffffffb5e;
  undefined1 in_stack_fffffffffffffb5f;
  HighsCliqueTable *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  HighsVarType in_stack_fffffffffffffb6f;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_fffffffffffffb70;
  HighsLp *in_stack_fffffffffffffb78;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_fffffffffffffb80;
  HighsLp *in_stack_fffffffffffffb88;
  Reason in_stack_fffffffffffffb90;
  HighsLp *in_stack_fffffffffffffb98;
  HighsLpRelaxation *in_stack_fffffffffffffba0;
  HighsMipSolverData *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  HighsInt in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  value_type in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  HighsInt in_stack_fffffffffffffbd4;
  double local_3c8;
  double local_390;
  bool local_242;
  bool local_241;
  int local_1f4;
  vector<double,_std::allocator<double>_> local_1f0;
  int local_1d4;
  HighsCDouble local_1d0;
  int local_1c0;
  int local_1bc;
  vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_> *local_1b8
  ;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  int local_18c;
  reference local_188;
  pair<int,_double> *local_180;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_178;
  long *local_170;
  vector<double,_std::allocator<double>_> local_168;
  double local_150;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *local_148;
  HashTableIterator<HighsHashTableEntry<int,_std::pair<double,_int>_>_> local_140;
  HashTableIterator<HighsHashTableEntry<int,_std::pair<double,_int>_>_> local_128;
  HighsHashTable<int,_std::pair<double,_int>_> *local_110;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  HighsSparseMatrix *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  value_type local_d0;
  ValueType *local_c8;
  int local_bc;
  Reason local_b8;
  Substitution *local_b0;
  uint local_a4;
  double local_a0;
  uint local_94;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  vector<int,_std::allocator<int>_> *local_80;
  bool local_71;
  HighsCDouble local_70 [2];
  HighsSolution *local_50;
  HighsHashTable<int,_std::pair<double,_int>_> local_48;
  byte local_19;
  HighsDomain *local_18;
  Status local_4;
  
  local_18 = in_RSI;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::clear
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x6097c3);
  do {
    local_19 = 0;
    if (local_18 != (HighsDomain *)0x0) {
      flushDomain(in_stack_fffffffffffffba0,(HighsDomain *)in_stack_fffffffffffffb98,
                  in_stack_fffffffffffffb90.index._3_1_);
    }
    SVar6 = run(in_stack_00005388,(bool)in_stack_00005387);
    *(Status *)((long)in_RDI + 0x53ac) = SVar6;
    iVar3 = *(int *)((long)in_RDI + 0x53ac);
    if (iVar3 == 1) {
LAB_0060984a:
      HighsHashTable<int,_std::pair<double,_int>_>::HighsHashTable
                (in_stack_fffffffffffffb80,(u64)in_stack_fffffffffffffb78);
      local_50 = Highs::getSolution((Highs *)(in_RDI + 1));
      HighsCDouble::HighsCDouble(local_70,0.0);
      local_71 = true;
      pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6098c2);
      local_80 = &pHVar8->integral_cols;
      local_88._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      local_90 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      while (bVar5 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffb50,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)),
            bVar5) {
        puVar9 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&local_88);
        local_94 = *puVar9;
        pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_50->col_value,(long)(int)local_94);
        pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
        __b = std::vector<double,_std::allocator<double>_>::operator[]
                        (&pHVar18->col_upper_,(long)(int)local_94);
        pdVar19 = std::min<double>(pvVar23,__b);
        pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
        pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&pHVar18->col_lower_,(long)(int)local_94);
        pdVar19 = std::max<double>(pdVar19,pvVar23);
        local_a0 = *pdVar19;
        dVar25 = fractionality<double>
                           ((double)in_stack_fffffffffffffb50,
                            (double *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48))
        ;
        pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x609a34);
        if (dVar25 < pHVar8->feastol || dVar25 == pHVar8->feastol) {
          pHVar10 = Highs::getBasis((Highs *)(in_RDI + 1));
          pvVar11 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                              (&pHVar10->col_status,(long)(int)local_94);
          if (*pvVar11 != kBasic) {
            pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x609f4b);
            pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&(pHVar8->domain).col_lower_,(long)(int)local_94);
            local_d0 = *pvVar22;
            pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x609f89);
            pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&(pHVar8->domain).col_upper_,(long)(int)local_94);
            dVar25 = *pvVar22;
            local_d8 = dVar25;
            pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&local_50->col_value,(long)(int)local_94);
            local_e0 = dVar25 - *pvVar23;
            pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&local_50->col_value,(long)(int)local_94);
            local_e8 = *pvVar23 - local_d0;
            pdVar19 = std::min<double>(&local_e0,&local_e8);
            dVar25 = *pdVar19;
            pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x60a070);
            if (pHVar8->feastol < dVar25) {
              pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
              local_f0 = &pHVar18->a_matrix_;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&(pHVar18->a_matrix_).start_,(long)(int)local_94);
              iVar3 = *pvVar12;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (*(long *)(*in_RDI + 0x10) + 0x90),(long)(int)(local_94 + 1));
              iVar4 = *pvVar12;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (*(long *)(*in_RDI + 0x10) + 0x90),(long)(int)local_94);
              local_f4 = iVar3 + (iVar4 - *pvVar12);
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_f0->start_,(long)(int)(local_94 + 1));
              local_f8 = *pvVar12;
              if (local_f4 != local_f8) {
                for (local_fc = local_f4; local_fc < local_f8; local_fc = local_fc + 1) {
                  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_f0->index_,(long)local_fc);
                  local_100 = *pvVar12;
                  pvVar13 = std::
                            vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                            ::operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                          *)(in_RDI + 0xa39),(long)local_100);
                  if (pvVar13->age != 0) {
                    pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (&local_50->row_value,(long)local_100);
                    dVar25 = *pvVar23;
                    pHVar18 = getLp((HighsLpRelaxation *)0x60a237);
                    pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (&pHVar18->row_upper_,(long)local_100);
                    dVar1 = *pvVar23;
                    pHVar8 = std::
                             unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                           *)0x60a281);
                    if (dVar1 - pHVar8->feastol <= dVar25) {
                      pvVar13 = std::
                                vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                ::operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                              *)(in_RDI + 0xa39),(long)local_100);
                      pvVar13->age = 0;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_a4 = local_94;
          local_241 = false;
          if ((local_71 & 1U) != 0) {
            pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x609a87);
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pHVar8->uplocks,(long)(int)local_a4);
            local_242 = true;
            if (*pvVar17 != 0) {
              pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x609ac6);
              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&pHVar8->downlocks,(long)(int)local_a4);
              local_242 = *pvVar17 == 0;
            }
            local_241 = local_242;
          }
          local_71 = local_241;
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x609b20);
          local_b0 = HighsCliqueTable::getSubstitution
                               (in_stack_fffffffffffffb60,
                                CONCAT13(in_stack_fffffffffffffb5f,
                                         CONCAT12(in_stack_fffffffffffffb5e,
                                                  in_stack_fffffffffffffb5c)));
          while (local_b0 != (Substitution *)0x0) {
            pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
            pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&pHVar18->col_lower_,(ulong)((uint)local_b0->replace & 0x7fffffff))
            ;
            dVar25 = *pvVar23;
            pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
            pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&pHVar18->col_upper_,(ulong)((uint)local_b0->replace & 0x7fffffff))
            ;
            if ((dVar25 == *pvVar23) && (!NAN(dVar25) && !NAN(*pvVar23))) {
              if (local_18 == (HighsDomain *)0x0) break;
              Highs::getLp((Highs *)(in_RDI + 1));
              HighsCliqueTable::CliqueVar::weight
                        ((CliqueVar *)in_stack_fffffffffffffb60,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_fffffffffffffb5f,
                                  CONCAT16(in_stack_fffffffffffffb5e,
                                           CONCAT24(in_stack_fffffffffffffb5c,
                                                    in_stack_fffffffffffffb58))));
              local_b8 = HighsDomain::Reason::unspecified();
              HighsDomain::fixCol((HighsDomain *)in_stack_fffffffffffffb88,
                                  (HighsInt)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                                  (double)in_stack_fffffffffffffb78,in_stack_fffffffffffffb90);
              bVar5 = HighsDomain::infeasible(local_18);
              if (bVar5) {
                in_RDI[0xa6c] = 0x7ff0000000000000;
                *(undefined4 *)((long)in_RDI + 0x53ac) = 2;
                local_4 = *(Status *)((long)in_RDI + 0x53ac);
                local_bc = 1;
                goto LAB_0060b112;
              }
            }
            local_a4 = (uint)local_b0->replace & 0x7fffffff;
            if (-1 < (int)local_b0->replace) {
              local_a0 = 1.0 - local_a0;
            }
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x609da8);
            local_b0 = HighsCliqueTable::getSubstitution
                                 (in_stack_fffffffffffffb60,
                                  CONCAT13(in_stack_fffffffffffffb5f,
                                           CONCAT12(in_stack_fffffffffffffb5e,
                                                    in_stack_fffffffffffffb5c)));
          }
          if ((*(byte *)(in_RDI + 0xa76) & 1) != 0) {
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x609e09);
            getLp((HighsLpRelaxation *)0x609e24);
            getLp((HighsLpRelaxation *)0x609e4f);
            local_a4 = HighsSymmetries::getBranchingColumn
                                 ((HighsSymmetries *)
                                  CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                                  (vector<double,_std::allocator<double>_> *)
                                  in_stack_fffffffffffffb60,
                                  (vector<double,_std::allocator<double>_> *)
                                  CONCAT17(in_stack_fffffffffffffb5f,
                                           CONCAT16(in_stack_fffffffffffffb5e,
                                                    CONCAT24(in_stack_fffffffffffffb5c,
                                                             in_stack_fffffffffffffb58))),
                                  (HighsInt)((ulong)in_stack_fffffffffffffb50 >> 0x20));
          }
          local_c8 = HighsHashTable<int,_std::pair<double,_int>_>::operator[]
                               ((HighsHashTable<int,_std::pair<double,_int>_> *)
                                CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                                (KeyType_conflict *)
                                CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
          local_c8->first = local_a0 + local_c8->first;
          local_c8->second = local_c8->second + 1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_88);
      }
      iVar14 = HighsHashTable<int,_std::pair<double,_int>_>::size(&local_48);
      local_104 = (int)iVar14;
      piVar15 = std::max<int>(&local_104,(int *)(in_RDI + 0xa75));
      *(int *)(in_RDI + 0xa75) = *piVar15;
      if (local_18 == (HighsDomain *)0x0) {
LAB_0060a3a1:
        local_110 = &local_48;
        HighsHashTable<int,_std::pair<double,_int>_>::begin(in_stack_fffffffffffffb70);
        HighsHashTable<int,_std::pair<double,_int>_>::end(in_stack_fffffffffffffb70);
        while (bVar5 = HighsHashTable<int,_std::pair<double,_int>_>::
                       HashTableIterator<HighsHashTableEntry<int,_std::pair<double,_int>_>_>::
                       operator!=(&local_128,&local_140), bVar5) {
          local_148 = HighsHashTable<int,_std::pair<double,_int>_>::
                      HashTableIterator<HighsHashTableEntry<int,_std::pair<double,_int>_>_>::
                      operator*(&local_128);
          HighsHashTableEntry<int,_std::pair<double,_int>_>::key(local_148);
          ppVar16 = HighsHashTableEntry<int,_std::pair<double,_int>_>::value(local_148);
          dVar25 = ppVar16->first;
          ppVar16 = HighsHashTableEntry<int,_std::pair<double,_int>_>::value(local_148);
          local_150 = dVar25 / (double)ppVar16->second;
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          emplace_back<int_const&,double>
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     in_stack_fffffffffffffb60,
                     (int *)CONCAT17(in_stack_fffffffffffffb5f,
                                     CONCAT16(in_stack_fffffffffffffb5e,
                                              CONCAT24(in_stack_fffffffffffffb5c,
                                                       in_stack_fffffffffffffb58))),
                     (double *)in_stack_fffffffffffffb50);
          HighsHashTable<int,_std::pair<double,_int>_>::
          HashTableIterator<HighsHashTableEntry<int,_std::pair<double,_int>_>_>::operator++
                    (&local_128);
        }
        if (((local_71 & 1U) != 0) &&
           (bVar5 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                    empty((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)in_stack_fffffffffffffb60), !bVar5)) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb98);
          local_170 = in_RDI + 0xa3c;
          local_178._M_current =
               (pair<int,_double> *)
               std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                         ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          local_180 = (pair<int,_double> *)
                      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ::end((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          while (bVar5 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                     *)in_stack_fffffffffffffb50,
                                    (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                                   ), bVar5) {
            local_188 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        ::operator*(&local_178);
            local_18c = local_188->first;
            pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x60a5e1);
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pHVar8->uplocks,(long)local_18c);
            if (*pvVar17 == 0) {
              dVar25 = HighsMipSolver::colCost(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
              if (0.0 <= dVar25) {
                pHVar8 = std::
                         unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                         operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x60a64c);
                pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&pHVar8->downlocks,(long)local_18c);
                if (*pvVar17 == 0) goto LAB_0060a824;
              }
              dVar25 = local_188->second;
              pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x60a699);
              local_198 = ceil(dVar25 - pHVar8->feastol);
              pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
              pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&pHVar18->col_upper_,(long)local_18c);
              if ((*pvVar23 != INFINITY) || (NAN(*pvVar23))) {
                pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
                pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&pHVar18->col_upper_,(long)local_18c);
                dVar25 = *pvVar23;
                pHVar8 = std::
                         unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                         operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x60a772);
                local_390 = floor(dVar25 + pHVar8->feastol);
              }
              else {
                local_390 = INFINITY;
              }
              local_1a0 = local_390;
              pdVar19 = std::min<double>(&local_198,&local_1a0);
              dVar25 = *pdVar19;
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_168,(long)local_18c);
              *pvVar22 = dVar25;
            }
            else {
LAB_0060a824:
              dVar25 = local_188->second;
              pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x60a851);
              local_1a8 = floor(dVar25 + pHVar8->feastol);
              pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
              pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&pHVar18->col_lower_,(long)local_18c);
              if ((*pvVar23 != -INFINITY) || (NAN(*pvVar23))) {
                pHVar18 = Highs::getLp((Highs *)(in_RDI + 1));
                pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&pHVar18->col_lower_,(long)local_18c);
                dVar25 = *pvVar23;
                pHVar8 = std::
                         unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                         operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x60a92a);
                local_3c8 = ceil(dVar25 - pHVar8->feastol);
              }
              else {
                local_3c8 = -INFINITY;
              }
              local_1b0 = local_3c8;
              pdVar19 = std::max<double>(&local_1a8,&local_1b0);
              dVar25 = *pdVar19;
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_168,(long)local_18c);
              *pvVar22 = dVar25;
            }
            __gnu_cxx::
            __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
            ::operator++(&local_178);
          }
          pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x60a9dc);
          local_1b8 = HighsCliqueTable::getSubstitutions(&pHVar8->cliquetable);
          sVar20 = std::
                   vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                   ::size(local_1b8);
          local_1bc = (int)sVar20;
          while (local_1bc = local_1bc + -1, -1 < local_1bc) {
            pvVar21 = std::
                      vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                      ::operator[](local_1b8,(long)local_1bc);
            if ((int)pvVar21->replace < 0) {
              pvVar21 = std::
                        vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                        ::operator[](local_1b8,(long)local_1bc);
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_168,(ulong)((uint)pvVar21->replace & 0x7fffffff));
              vVar2 = *pvVar22;
              pvVar21 = std::
                        vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                        ::operator[](local_1b8,(long)local_1bc);
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_168,(long)pvVar21->substcol);
              *pvVar22 = vVar2;
            }
            else {
              pvVar21 = std::
                        vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                        ::operator[](local_1b8,(long)local_1bc);
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_168,(ulong)((uint)pvVar21->replace & 0x7fffffff));
              dVar25 = *pvVar22;
              pvVar21 = std::
                        vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                        ::operator[](local_1b8,(long)local_1bc);
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_168,(long)pvVar21->substcol);
              *pvVar22 = 1.0 - dVar25;
            }
          }
          for (local_1c0 = 0; iVar3 = local_1c0,
              HVar7 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI), iVar3 != HVar7;
              local_1c0 = local_1c0 + 1) {
            std::vector<double,_std::allocator<double>_>::operator[](&local_168,(long)local_1c0);
            HighsMipSolver::colCost(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
            HighsCDouble::operator+=
                      ((HighsCDouble *)in_stack_fffffffffffffb60,
                       (double)CONCAT17(in_stack_fffffffffffffb5f,
                                        CONCAT16(in_stack_fffffffffffffb5e,
                                                 CONCAT24(in_stack_fffffffffffffb5c,
                                                          in_stack_fffffffffffffb58))));
          }
          pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x60ac2a);
          HighsCDouble::operator_cast_to_double(local_70);
          HighsMipSolverData::addIncumbent
                    (pHVar8,(vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     in_stack_fffffffffffffbc8,(int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x10,0));
          HighsCDouble::HighsCDouble(&local_1d0,0.0);
          local_70[0].hi = local_1d0.hi;
          local_70[0].lo = local_1d0.lo;
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
        }
        local_1d4 = 0;
        while (in_stack_fffffffffffffbd0 = local_1d4,
              in_stack_fffffffffffffbd4 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI),
              in_stack_fffffffffffffbd0 != in_stack_fffffffffffffbd4) {
          pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&local_50->col_value,(long)local_1d4);
          in_stack_fffffffffffffbc0 = *pvVar23;
          in_stack_fffffffffffffbc8 =
               HighsMipSolver::colCost(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
          HighsCDouble::operator+=
                    ((HighsCDouble *)in_stack_fffffffffffffb60,
                     (double)CONCAT17(in_stack_fffffffffffffb5f,
                                      CONCAT16(in_stack_fffffffffffffb5e,
                                               CONCAT24(in_stack_fffffffffffffb5c,
                                                        in_stack_fffffffffffffb58))));
          local_1d4 = local_1d4 + 1;
        }
        bVar5 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                          ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)in_stack_fffffffffffffb60);
        if (bVar5) {
          bVar5 = unscaledPrimalFeasible(*(Status *)((long)in_RDI + 0x53ac));
          in_stack_fffffffffffffbbc = CONCAT13(bVar5,(int3)in_stack_fffffffffffffbbc);
          if (!bVar5) {
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                       (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb98);
            local_1f4 = 0;
            while (in_stack_fffffffffffffbb4 = local_1f4,
                  in_stack_fffffffffffffbb8 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI),
                  in_stack_fffffffffffffbb4 < in_stack_fffffffffffffbb8) {
              pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_1f0,(long)local_1f4);
              in_stack_fffffffffffffba0 = (HighsLpRelaxation *)*pvVar22;
              in_stack_fffffffffffffba8 = (HighsMipSolverData *)Highs::getLp((Highs *)(in_RDI + 1));
              pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &(in_stack_fffffffffffffba8->cutpool).matrix_.ARindex_,
                                   (long)local_1f4);
              if (*pvVar23 <= (double)in_stack_fffffffffffffba0) {
                pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&local_1f0,(long)local_1f4);
                in_stack_fffffffffffffb80 = (HighsHashTable<int,_std::pair<double,_int>_> *)*pvVar22
                ;
                in_stack_fffffffffffffb88 = Highs::getLp((Highs *)(in_RDI + 1));
                pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&in_stack_fffffffffffffb88->col_upper_,(long)local_1f4);
                if ((double)in_stack_fffffffffffffb80 < *pvVar23 ||
                    (double)in_stack_fffffffffffffb80 == *pvVar23) {
                  in_stack_fffffffffffffb6f =
                       HighsMipSolver::variableType
                                 (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
                  if (in_stack_fffffffffffffb6f != kContinuous) {
                    pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (&local_1f0,(long)local_1f4);
                    in_stack_fffffffffffffb60 = (HighsCliqueTable *)round(*pvVar22);
                    pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (&local_1f0,(long)local_1f4);
                    *pvVar22 = (value_type)in_stack_fffffffffffffb60;
                  }
                }
                else {
                  in_stack_fffffffffffffb78 = Highs::getLp((Highs *)(in_RDI + 1));
                  pvVar23 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (&in_stack_fffffffffffffb78->col_upper_,(long)local_1f4);
                  in_stack_fffffffffffffb70 =
                       (HighsHashTable<int,_std::pair<double,_int>_> *)*pvVar23;
                  pvVar22 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (&local_1f0,(long)local_1f4);
                  *pvVar22 = (value_type)in_stack_fffffffffffffb70;
                }
              }
              else {
                in_stack_fffffffffffffb98 = Highs::getLp((Highs *)(in_RDI + 1));
                pRVar24 = (Reason *)
                          std::vector<double,_std::allocator<double>_>::operator[]
                                    (&in_stack_fffffffffffffb98->col_lower_,(long)local_1f4);
                in_stack_fffffffffffffb90 = *pRVar24;
                pRVar24 = (Reason *)
                          std::vector<double,_std::allocator<double>_>::operator[]
                                    (&local_1f0,(long)local_1f4);
                *pRVar24 = in_stack_fffffffffffffb90;
              }
              local_1f4 = local_1f4 + 1;
            }
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x60b04b);
            in_stack_fffffffffffffb5f =
                 HighsMipSolverData::checkSolution
                           (in_stack_fffffffffffffba8,
                            (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0);
            if ((bool)in_stack_fffffffffffffb5f) {
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_fffffffffffffb5f,
                                  CONCAT16(in_stack_fffffffffffffb5e,
                                           CONCAT24(in_stack_fffffffffffffb5c,
                                                    in_stack_fffffffffffffb58))));
              in_stack_fffffffffffffb5e = unscaledDualFeasible(*(Status *)((long)in_RDI + 0x53ac));
              if ((bool)in_stack_fffffffffffffb5e) {
                *(undefined4 *)((long)in_RDI + 0x53ac) = 1;
              }
              else {
                *(undefined4 *)((long)in_RDI + 0x53ac) = 4;
              }
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
          }
        }
        in_stack_fffffffffffffb50 =
             (HighsMipSolver *)HighsCDouble::operator_cast_to_double(local_70);
        in_RDI[0xa6c] = (long)in_stack_fffffffffffffb50;
        local_bc = 4;
      }
      else {
        HighsDomain::getChangedCols(local_18);
        bVar5 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60);
        if (bVar5) goto LAB_0060a3a1;
        local_19 = 1;
        local_bc = 3;
      }
LAB_0060b112:
      HighsHashTable<int,_std::pair<double,_int>_>::~HighsHashTable
                ((HighsHashTable<int,_std::pair<double,_int>_> *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb4c = local_bc;
      if (local_bc == 1) {
        return local_4;
      }
    }
    else if (iVar3 == 2) {
      in_RDI[0xa6c] = 0x7ff0000000000000;
    }
    else if (iVar3 - 3U < 3) goto LAB_0060984a;
    if ((local_19 & 1) == 0) {
      return *(Status *)((long)in_RDI + 0x53ac);
    }
  } while( true );
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::resolveLp(HighsDomain* domain) {
  fractionalints.clear();

  bool solveagain;
  do {
    solveagain = false;
    if (domain) flushDomain(*domain);
    status = run();

    switch (status) {
      case Status::kUnscaledInfeasible:
      case Status::kUnscaledDualFeasible:
      case Status::kUnscaledPrimalFeasible:
      case Status::kOptimal: {
        HighsHashTable<HighsInt, std::pair<double, int>> fracints(
            maxNumFractional);
        const HighsSolution& sol = lpsolver.getSolution();

        HighsCDouble objsum = 0;
        bool roundable = true;

        for (HighsInt i : mipsolver.mipdata_->integral_cols) {
          // for the fractionality we assume that LP bounds are not violated
          // bounds that are violated by the unscaled LP are indicated by the
          // return status already
          double val = std::max(
              std::min(sol.col_value[i], lpsolver.getLp().col_upper_[i]),
              lpsolver.getLp().col_lower_[i]);

          if (fractionality(val) > mipsolver.mipdata_->feastol) {
            HighsInt col = i;
            roundable = roundable && (mipsolver.mipdata_->uplocks[col] == 0 ||
                                      mipsolver.mipdata_->downlocks[col] == 0);

            const HighsCliqueTable::Substitution* subst =
                mipsolver.mipdata_->cliquetable.getSubstitution(col);
            while (subst != nullptr) {
              if (lpsolver.getLp().col_lower_[subst->replace.col] ==
                  lpsolver.getLp().col_upper_[subst->replace.col]) {
                if (domain) {
                  domain->fixCol(
                      col, subst->replace.weight(lpsolver.getLp().col_lower_));
                  if (domain->infeasible()) {
                    objective = kHighsInf;
                    status = Status::kInfeasible;
                    return status;
                  }
                } else
                  break;
              }

              col = subst->replace.col;
              if (subst->replace.val == 0) val = 1.0 - val;

              subst = mipsolver.mipdata_->cliquetable.getSubstitution(col);
            }

            if (adjustSymBranchingCol)
              col = mipsolver.mipdata_->symmetries.getBranchingColumn(
                  getLp().col_lower_, getLp().col_upper_, col);

            auto& pair = fracints[col];
            pair.first += val;
            pair.second += 1;
          } else {
            if (lpsolver.getBasis().col_status[i] == HighsBasisStatus::kBasic)
              continue;

            const double glb = mipsolver.mipdata_->domain.col_lower_[i];
            const double gub = mipsolver.mipdata_->domain.col_upper_[i];

            if (std::min(gub - sol.col_value[i], sol.col_value[i] - glb) <=
                mipsolver.mipdata_->feastol)
              continue;

            const auto& matrix = lpsolver.getLp().a_matrix_;
            const HighsInt colStart =
                matrix.start_[i] + (mipsolver.model_->a_matrix_.start_[i + 1] -
                                    mipsolver.model_->a_matrix_.start_[i]);
            const HighsInt colEnd = matrix.start_[i + 1];

            // skip further checks if the column has no entry in any cut
            if (colStart == colEnd) continue;

            for (HighsInt j = colStart; j < colEnd; ++j) {
              HighsInt row = matrix.index_[j];
              assert(row >= mipsolver.numRow());

              // age is already zero, so irrelevant whether we reset it
              if (lprows[row].age == 0) continue;

              // check that row has no slack in the current solution
              if (sol.row_value[row] <
                  getLp().row_upper_[row] - mipsolver.mipdata_->feastol)
                continue;

              lprows[row].age = 0;
            }
          }
        }

        maxNumFractional =
            std::max((HighsInt)fracints.size(), maxNumFractional);

        if (domain && !domain->getChangedCols().empty()) {
          // printf("resolving due to fixings of substituted columns\n");
          solveagain = true;
          continue;
        }

        for (const auto& it : fracints) {
          fractionalints.emplace_back(
              it.key(), it.value().first / (double)it.value().second);
        }

        if (roundable && !fractionalints.empty()) {
          std::vector<double> roundsol = sol.col_value;

          for (const std::pair<HighsInt, double>& fracint : fractionalints) {
            // get column index
            HighsInt col = fracint.first;
            // round based on locks and sign of objective coefficient
            if (mipsolver.mipdata_->uplocks[col] == 0 &&
                (mipsolver.colCost(col) < 0 ||
                 mipsolver.mipdata_->downlocks[col] != 0)) {
              // round up
              roundsol[col] = std::min(
                  std::ceil(fracint.second - mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_upper_[col] == kHighsInf
                      ? kHighsInf
                      : std::floor(lpsolver.getLp().col_upper_[col] +
                                   mipsolver.mipdata_->feastol));
            } else {
              // round down
              roundsol[col] = std::max(
                  std::floor(fracint.second + mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_lower_[col] == -kHighsInf
                      ? -kHighsInf
                      : std::ceil(lpsolver.getLp().col_lower_[col] -
                                  mipsolver.mipdata_->feastol));
            }
          }

          const auto& cliquesubst =
              mipsolver.mipdata_->cliquetable.getSubstitutions();
          for (HighsInt k = cliquesubst.size() - 1; k >= 0; --k) {
            if (cliquesubst[k].replace.val == 0)
              roundsol[cliquesubst[k].substcol] =
                  1 - roundsol[cliquesubst[k].replace.col];
            else
              roundsol[cliquesubst[k].substcol] =
                  roundsol[cliquesubst[k].replace.col];
          }

          for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
            objsum += roundsol[i] * mipsolver.colCost(i);

          mipsolver.mipdata_->addIncumbent(roundsol, double(objsum),
                                           kSolutionSourceSolveLp);
          objsum = 0;
        }

        for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
          objsum += sol.col_value[i] * mipsolver.colCost(i);

        if (fractionalints.empty() && !unscaledPrimalFeasible(status)) {
          std::vector<double> fixSol = sol.col_value;
          for (HighsInt i = 0; i < mipsolver.numCol(); ++i) {
            if (fixSol[i] < lpsolver.getLp().col_lower_[i])
              fixSol[i] = lpsolver.getLp().col_lower_[i];
            else if (fixSol[i] > lpsolver.getLp().col_upper_[i])
              fixSol[i] = lpsolver.getLp().col_upper_[i];
            else if (mipsolver.variableType(i) != HighsVarType::kContinuous)
              fixSol[i] = std::round(fixSol[i]);
          }

          if (mipsolver.mipdata_->checkSolution(fixSol)) {
            const_cast<std::vector<double>&>(sol.col_value) = std::move(fixSol);
            if (unscaledDualFeasible(status))
              status = Status::kOptimal;
            else
              status = Status::kUnscaledPrimalFeasible;
          }
        }

        objective = double(objsum);
        break;
      }
      case Status::kInfeasible:
        objective = kHighsInf;
        break;
      default:
        break;
    }
  } while (solveagain);

  return status;
}